

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O3

void __thiscall FZFile::decode(FZFile *this,char *source,size_t size)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  long lVar14;
  undefined4 local_38;
  int iStack_34;
  uint uStack_30;
  byte bStack_2c;
  byte bStack_2b;
  byte bStack_2a;
  byte bStack_29;
  uint8_t ibuf [16];
  
  local_38 = 0;
  iStack_34 = 0;
  uStack_30 = 0;
  bStack_2c = 0;
  bStack_2b = 0;
  bStack_2a = 0;
  bStack_29 = 0;
  if (size != 0) {
    uVar8 = 0;
    sVar12 = 0;
    uVar10 = 0;
    do {
      lVar14 = 0;
      uVar11 = iStack_34 + (this->key)._M_elems[0];
      uVar10 = uVar10 + (this->key)._M_elems[1];
      uVar9 = uStack_30;
      do {
        uVar13 = uVar10;
        uVar6 = uVar11;
        uVar10 = (uVar6 * 2 + 1) * uVar6;
        uVar11 = uVar10 * 0x20 | uVar10 >> 0x1b;
        uVar10 = (uVar13 * 2 + 1) * uVar13;
        uVar10 = uVar10 * 0x20 | uVar10 >> 0x1b;
        uVar7 = (uint)uVar8 ^ uVar11;
        bVar1 = (byte)uVar10 & 0x1f;
        uVar10 = uVar10 ^ uVar9;
        bVar2 = (byte)uVar11 & 0x1f;
        lVar4 = lVar14 * 2;
        lVar5 = lVar14 * 2;
        lVar14 = lVar14 + 1;
        uVar8 = (ulong)uVar6;
        uVar11 = (uVar10 << bVar2 | uVar10 >> 0x20 - bVar2) + (this->key)._M_elems[lVar5 + 3];
        uVar10 = (uVar7 << bVar1 | uVar7 >> 0x20 - bVar1) + (this->key)._M_elems[lVar4 + 2];
        uVar9 = uVar13;
      } while (lVar14 != 0x14);
      bVar1 = source[sVar12];
      source[sVar12] = (char)uVar6 + (char)(this->key)._M_elems[0x2a] ^ bVar1;
      uVar3 = CONCAT11(bStack_2a,bStack_2b);
      uVar11 = CONCAT13(bStack_2c,uStack_30._1_3_);
      uVar8 = CONCAT17((undefined1)uStack_30,CONCAT43(iStack_34,local_38._1_3_));
      local_38 = (undefined4)CONCAT43(iStack_34,local_38._1_3_);
      iStack_34 = (int)(uVar8 >> 0x20);
      bStack_2c = bStack_2b;
      bStack_2b = bStack_2a;
      uVar10 = (uint)bVar1 << 0x18 | (uint)uVar3 | (uint)bStack_29 << 0x10;
      sVar12 = sVar12 + 1;
      uStack_30 = uVar11;
      bStack_2a = bStack_29;
      bStack_29 = bVar1;
    } while (sVar12 != size);
  }
  return;
}

Assistant:

void FZFile::decode(char *source, size_t size) const {
	// Along the lines of http://people.csail.mit.edu/rivest/pubs/RRSY98.pdf
	// (page 3, 2.2)
	int32_t logw = 5;
	uint32_t r   = 20;

	uint32_t A = 0;
	uint32_t B = 0;
	uint32_t C = 0;
	uint32_t D = 0;

	uint8_t currentByte;
	uint8_t ibuf[16] = {0}; // you'll see

	// RC6 algo from the paper, basically 1:1
	for (size_t pos = 0; pos < size; ++pos) {
		B = B + key[0];
		D = D + key[1];
		for (uint32_t i = 1; i < (r + 1); ++i) { // loop offset by 1
			uint32_t t = rotl32(B * (2 * B + 1), logw);
			uint32_t u = rotl32(D * (2 * D + 1), logw);
			A          = rotl32(A ^ t, u) + key[2 * i];
			C          = rotl32(C ^ u, t) + key[2 * i + 1];

			uint32_t tmp = A;
			A            = B;
			B            = C;
			C            = D;
			D            = tmp;
		}
		A = A + key[2 * r + 2];
		C = C + key[2 * r + 3]; // not used I guess

		// rolling over the the uint8_t string
		// buf[pos] xor A -> is our resulting byte
		currentByte = source[pos];
		source[pos] = ((uint8_t)(currentByte ^ (A & 0xFF)));
		// fprintf(stdout,"%c",source[pos]);

		// pushing in a stream of buf[pos] chars 'from the right'
		// and shift whole array 8 bits to the left
		for (uint32_t i = 0; i < 15; ++i) {
			ibuf[i] = ibuf[i + 1];
		}
		ibuf[15] = currentByte;

		// align 4 consequent int32s to that buffer
		// (A, B, C, D) = (buf[0], buf[1], buf[2], buf[3])
		// byte order?!
		A = ibuf[0] | ibuf[1] << 8 | ibuf[2] << 16 | ibuf[3] << 24;
		B = ibuf[4] | ibuf[5] << 8 | ibuf[6] << 16 | ibuf[7] << 24;
		C = ibuf[8] | ibuf[9] << 8 | ibuf[10] << 16 | ibuf[11] << 24;
		D = ibuf[12] | ibuf[13] << 8 | ibuf[14] << 16 | ibuf[15] << 24;
	}
}